

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  string *psVar1;
  LogMessage local_20 [16];
  
  if (count == 0) {
    WriteBuffer(this);
    return;
  }
  psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(count,0,"count >= 0");
  if (psVar1 == (string *)0x0) {
    psVar1 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                       (this->buffer_used_,this->buffer_size_,"buffer_used_ == buffer_size_");
    if (psVar1 == (string *)0x0) {
      psVar1 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                         (count,this->buffer_used_,"count <= buffer_used_");
      if (psVar1 == (string *)0x0) {
        this->buffer_used_ = this->buffer_used_ - count;
        return;
      }
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x13f,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (local_20,(char (*) [78])
                          " Can\'t back up over more bytes than were returned by the last call to Next()."
                );
    }
    else {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x13d,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (local_20,(char (*) [43])" BackUp() can only be called after Next().");
    }
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x13c,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  if (count == 0) {
    Flush();
    return;
  }
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}